

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O2

int getoken(expr *expr,ex_ex *eptr)

{
  long *type;
  char cVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  ushort **ppuVar6;
  long lVar7;
  char *s;
  long lVar8;
  long lStack_50;
  ex_ex ex;
  
  if (expr->exp_str == (char *)0x0) {
    post("expr: getoken: expression string not set\n");
    return 0;
  }
  type = &eptr->ex_type;
  pcVar5 = expr->exp_str;
switchD_0018f620_caseD_20:
  s = pcVar5;
  if (*s == ';') {
    expr->exp_str = s + 1;
LAB_0018f678:
    (eptr->ex_cont).v_int = 0;
    eptr->ex_type = 0;
    return 0;
  }
  if (*s == '\0') goto LAB_0018f678;
  *type = 3;
  pcVar5 = s + 1;
  expr->exp_str = pcVar5;
  cVar1 = *s;
  switch(cVar1) {
  case ' ':
  case '\\':
    goto switchD_0018f620_caseD_20;
  case '!':
    if (s[1] == '=') {
      (eptr->ex_cont).v_vec = (t_float *)0x90008;
LAB_0018f92a:
      expr->exp_str = expr->exp_str + 1;
    }
    else {
      (eptr->ex_cont).v_vec = (t_float *)0xe0017;
    }
    return 0;
  case '\"':
    ex.ex_end = (ex_ex *)0x0;
    ex.ex_cont.v_int = 0;
    ex.ex_type = 0;
    if ((s[1] == '\"') || (s[1] == '\0')) {
      expr->exp_str = s;
      pcVar5 = "expr: syntax error: empty symbol: %s\n";
      goto LAB_0018fb44;
    }
    iVar4 = getoken(expr,&ex);
    if (iVar4 != 0) {
      return 1;
    }
    if (ex.ex_type == 0xd) {
      eptr->ex_end = ex.ex_end;
      eptr->ex_cont = ex.ex_cont;
      eptr->ex_type = 0xd;
      lStack_50 = 8;
    }
    else {
      if (ex.ex_type != 4) {
        s = s + 1;
        pcVar5 = "expr: syntax error: bad symbol name: %s\n";
        goto LAB_0018fb44;
      }
      iVar4 = ex_getsym(ex.ex_cont.ptr,(fts_symbol_t *)eptr);
      if (iVar4 != 0) {
        pcVar5 = "expr: syntax error: getoken: problms with ex_getsym\n";
        goto LAB_0018f858;
      }
      lStack_50 = 7;
    }
    *type = lStack_50;
    pcVar5 = expr->exp_str;
    expr->exp_str = pcVar5 + 1;
    if (*pcVar5 == '\"') {
      return 0;
    }
    pcVar5 = "expr: syntax error: missing \'\"\'\n";
    goto LAB_0018f858;
  case '$':
    pcVar5 = s + 2;
    expr->exp_str = pcVar5;
    bVar2 = s[1];
    if (bVar2 - 0x30 < 10) goto LAB_0018f9da;
    switch(bVar2) {
    case 0x53:
      goto switchD_0018f9b5_caseD_73;
    case 0x54:
    case 0x55:
    case 0x57:
      goto switchD_0018f9b5_caseD_74;
    case 0x56:
switchD_0018f9b5_caseD_76:
      if ((expr->exp_flags & 5) == 0) {
        lStack_50 = 0xe;
        goto LAB_0018faef;
      }
      pcVar5 = "$v? works only for expr~";
LAB_0018fa52:
      post(pcVar5);
      goto LAB_0018fb2f;
    case 0x58:
switchD_0018f9b5_caseD_78:
      if ((expr->exp_flags & 3) != 0) {
        pcVar5 = "$x? works only for fexpr~";
        goto LAB_0018fa52;
      }
      *type = 0x12;
      ppuVar6 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar6 + (long)*pcVar5 * 2 + 1) & 8) == 0) {
        (eptr->ex_cont).v_int = 0;
        expr->exp_var[0].ex_type = 0x12;
        return 0;
      }
      break;
    case 0x59:
switchD_0018f9b5_caseD_79:
      if ((expr->exp_flags & 3) != 0) {
        post("$y works only for fexpr~");
        pcVar5 = expr->exp_str;
LAB_0018f9da:
        expr->exp_str = pcVar5 + -1;
        pcVar5 = atoif(pcVar5 + -1,(long *)eptr,(long *)&ex);
        if (pcVar5 == (char *)0x0) {
          return 1;
        }
        if (ex.ex_cont.v_int == 1) {
          expr->exp_str = pcVar5;
          eptr->ex_type = 1;
          (eptr->ex_cont).v_int = 0;
          return 0;
        }
        post("expr: syntax error: %s\n",expr->exp_str);
        return 1;
      }
      *type = 0x10;
      ppuVar6 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar6 + (long)*pcVar5 * 2 + 1) & 8) == 0) {
        (eptr->ex_cont).v_int = 0;
        expr->exp_var[0].ex_type = 0x10;
        return 0;
      }
      break;
    default:
      switch(bVar2) {
      case 0x73:
switchD_0018f9b5_caseD_73:
        lStack_50 = 0xd;
        break;
      case 0x74:
      case 0x75:
      case 0x77:
        goto switchD_0018f9b5_caseD_74;
      case 0x76:
        goto switchD_0018f9b5_caseD_76;
      case 0x78:
        goto switchD_0018f9b5_caseD_78;
      case 0x79:
        goto switchD_0018f9b5_caseD_79;
      default:
        if (bVar2 == 0x46) {
LAB_0018fa5e:
          lStack_50 = 0xc;
        }
        else {
          lStack_50 = 0xb;
          if (bVar2 == 0x49) break;
          if (bVar2 == 0x66) goto LAB_0018fa5e;
          if (bVar2 != 0x69) goto switchD_0018f9b5_caseD_74;
        }
      }
LAB_0018faef:
      *type = lStack_50;
    }
    pcVar5 = atoif(pcVar5,(long *)eptr,(long *)&ex);
    if (pcVar5 == (char *)0x0) {
LAB_0018fb2f:
      s = expr->exp_str + -2;
    }
    else {
      if (ex.ex_cont.v_int == 1) {
        lVar7 = (eptr->ex_cont).v_int;
        if (lVar7 != 0) {
          (eptr->ex_cont).v_vec = (t_float *)(lVar7 + -1);
          if (lVar7 < 0x65) {
            if (((t_float *)(lVar7 + -1) == (t_float *)0x0) &&
               ((expr->exp_flags & 3U) == 0 || (expr->exp_flags & 5U) == 0)) {
              lVar8 = *type;
              if (lVar8 - 0xbU < 3) {
                pcVar5 = "first inlet of expr~/fexpr~ can only be a vector";
LAB_0018f858:
                post(pcVar5);
                return 1;
              }
            }
            else {
              lVar8 = *type;
            }
            if (lVar8 != 0x10) {
              lVar3 = expr->exp_var[lVar7 + -1].ex_type;
              if (lVar3 == 0) {
                expr->exp_var[lVar7 + -1].ex_type = lVar8;
              }
              else if (lVar3 != lVar8) {
                s = expr->exp_str;
                pcVar5 = "expr: syntax error: inlets can only have one type: %s\n";
                goto LAB_0018fb44;
              }
            }
LAB_0018f66b:
            expr->exp_str = pcVar5;
            return 0;
          }
        }
        s = expr->exp_str;
        pcVar5 = "expr: syntax error: inlet or outlet out of range: %s\n";
        goto LAB_0018fb44;
      }
      s = expr->exp_str;
    }
    pcVar5 = "expr: syntax error: %s\n";
    goto LAB_0018fb44;
  case '%':
    (eptr->ex_cont).v_vec = (t_float *)0xd0012;
    return 0;
  case '&':
    if (s[1] == '&') {
      expr->exp_str = s + 2;
      (eptr->ex_cont).v_vec = (t_float *)0x50004;
      return 0;
    }
    (eptr->ex_cont).v_vec = (t_float *)0x80007;
    return 0;
  case '(':
    (eptr->ex_cont).v_vec = (t_float *)0xf001b;
    return 0;
  case ')':
    (eptr->ex_cont).v_vec = (t_float *)0xf001a;
    return 0;
  case '*':
    (eptr->ex_cont).v_vec = (t_float *)0xd0014;
    return 0;
  case '+':
    (eptr->ex_cont).v_vec = (t_float *)0xc0011;
    return 0;
  case ',':
    (eptr->ex_cont).v_vec = (t_float *)0x20002;
    return 0;
  case '-':
    (eptr->ex_cont).v_vec = (t_float *)0xc0010;
    return 0;
  case '.':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    expr->exp_str = s;
    pcVar5 = atoif(s,(long *)eptr,type);
    if (pcVar5 == (char *)0x0) {
      return 1;
    }
    goto LAB_0018f66b;
  case '/':
    (eptr->ex_cont).v_vec = (t_float *)0xd0013;
    return 0;
  case ';':
    pcVar5 = "expr: syntax error: \';\' not implemented\n";
    goto LAB_0018f858;
  case '<':
    if (s[1] == '=') {
      (eptr->ex_cont).v_vec = (t_float *)0xa000c;
    }
    else {
      if (s[1] != '<') {
        (eptr->ex_cont).v_vec = (t_float *)0xa000d;
        return 0;
      }
      (eptr->ex_cont).v_vec = (t_float *)0xb000f;
    }
    goto LAB_0018f92a;
  case '=':
    if (s[1] == '=') {
      expr->exp_str = s + 2;
      (eptr->ex_cont).v_vec = (t_float *)0x90009;
      return 0;
    }
    (eptr->ex_cont).v_vec = (t_float *)0x3001c;
    return 0;
  case '>':
    if (s[1] == '=') {
      (eptr->ex_cont).v_vec = (t_float *)0xa000a;
    }
    else {
      if (s[1] != '>') {
        (eptr->ex_cont).v_vec = (t_float *)0xa000b;
        return 0;
      }
      (eptr->ex_cont).v_vec = (t_float *)0xb000e;
    }
    goto LAB_0018f92a;
  case '[':
    (eptr->ex_cont).v_vec = (t_float *)0xf0019;
    return 0;
  case ']':
    (eptr->ex_cont).v_vec = (t_float *)0xf0018;
    return 0;
  case '^':
    (eptr->ex_cont).v_vec = (t_float *)0x70006;
    return 0;
  default:
    if (cVar1 == '\t') goto switchD_0018f620_caseD_20;
    if (cVar1 == '|') {
      if (s[1] == '|') {
        expr->exp_str = s + 2;
        (eptr->ex_cont).v_vec = (t_float *)0x40003;
        return 0;
      }
      (eptr->ex_cont).v_vec = (t_float *)0x60005;
      return 0;
    }
    if (cVar1 == '~') {
      (eptr->ex_cont).v_vec = (t_float *)0xe0016;
      return 0;
    }
  case '#':
  case '\'':
  case ':':
  case '?':
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
    expr->exp_str = s;
    lVar8 = 0;
    lVar7 = 0;
    while (((bVar2 = s[lVar7], (byte)(bVar2 - 0x30) < 10 || (bVar2 == 0x5f)) ||
           ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a))) {
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x100000000;
    }
    if (lVar7 != 0) {
      pcVar5 = (char *)malloc(lVar7 + 1);
      (eptr->ex_cont).ptr = pcVar5;
      strncpy(pcVar5,expr->exp_str,lVar8 >> 0x20);
      pcVar5[lVar7] = '\0';
      expr->exp_str = s + lVar7;
      eptr->ex_type = 4;
      return 0;
    }
switchD_0018f9b5_caseD_74:
    pcVar5 = "expr: syntax error: %s\n";
LAB_0018fb44:
    post(pcVar5,s);
    return 1;
  }
}

Assistant:

int
getoken(struct expr *expr, struct ex_ex *eptr)
{
        char *p;
        long i;


        if (!expr->exp_str) {
                post("expr: getoken: expression string not set\n");
                return (0);
        }
retry:
        if (!*expr->exp_str) {
                eptr->ex_type = 0;
                eptr->ex_int = 0;
                return (0);
        }
        if (*expr->exp_str == ';') {
                expr->exp_str++;
                eptr->ex_type = 0;
                eptr->ex_int = 0;
                return (0);
        }
        eptr->ex_type = ET_OP;
        switch (*expr->exp_str++) {
        case '\\':
        case ' ':
        case '\t':
                goto retry;
        case ';':
                post("expr: syntax error: ';' not implemented\n");
                return (1);
        case ',':
                eptr->ex_op = OP_COMMA;
                break;
        case '(':
                eptr->ex_op = OP_LP;
                break;
        case ')':
                eptr->ex_op = OP_RP;
                break;
        case ']':
                eptr->ex_op = OP_RB;
                break;
        case '~':
                eptr->ex_op = OP_NEG;
                break;
                /* we will take care of unary minus later */
        case '*':
                eptr->ex_op = OP_MUL;
                break;
        case '/':
                eptr->ex_op = OP_DIV;
                break;
        case '%':
                eptr->ex_op = OP_MOD;
                break;
        case '+':
                eptr->ex_op = OP_ADD;
                break;
        case '-':
                eptr->ex_op = OP_SUB;
                break;
        case '^':
                eptr->ex_op = OP_XOR;
                break;
        case '[':
                eptr->ex_op = OP_LB;
                break;
        case '!':
                if (*expr->exp_str == '=') {
                        eptr->ex_op = OP_NE;
                        expr->exp_str++;
                } else
                        eptr->ex_op = OP_NOT;
                break;
        case '<':
                switch (*expr->exp_str) {
                case '<':
                        eptr->ex_op = OP_SL;
                        expr->exp_str++;
                        break;
                case '=':
                        eptr->ex_op = OP_LE;
                        expr->exp_str++;
                        break;
                default:
                        eptr->ex_op = OP_LT;
                        break;
                }
                break;
        case '>':
                switch (*expr->exp_str) {
                case '>':
                        eptr->ex_op = OP_SR;
                        expr->exp_str++;
                        break;
                case '=':
                        eptr->ex_op = OP_GE;
                        expr->exp_str++;
                        break;
                default:
                        eptr->ex_op = OP_GT;
                        break;
                }
                break;
        case '=':
                if (*expr->exp_str != '=')
                        eptr->ex_op = OP_STORE;
                else {
                        expr->exp_str++;
                        eptr->ex_op = OP_EQ;
                }
                break;

        case '&':
                if (*expr->exp_str == '&') {
                        expr->exp_str++;
                        eptr->ex_op = OP_LAND;
                } else
                        eptr->ex_op = OP_AND;
                break;

        case '|':
                if (*expr->exp_str == '|') {
                        expr->exp_str++;
                        eptr->ex_op = OP_LOR;
                } else
                        eptr->ex_op = OP_OR;
                break;
        case '$':
                switch (*expr->exp_str++) {
                case 'I':
                case 'i':
                        eptr->ex_type = ET_II;
                        break;
                case 'F':
                case 'f':
                        eptr->ex_type = ET_FI;
                        break;
                case 'S':
                case 's':
                        eptr->ex_type = ET_SI;
                        break;
                case 'V':
                case 'v':
                        if (IS_EXPR_TILDE(expr)) {
                                eptr->ex_type = ET_VI;
                                break;
                        }
                        post("$v? works only for expr~");
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                case 'X':
                case 'x':
                        if (IS_FEXPR_TILDE(expr)) {
                                eptr->ex_type = ET_XI;
                                if (isdigit((int)(*expr->exp_str)))
                                        break;
                                /* for $x[] is a shorhand for $x1[] */
                                /* eptr->ex_int = 0; */
                                                                eptr->ex_op = 0;
                                                                expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                                goto noinletnum;
                        }
                        post("$x? works only for fexpr~");
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                case 'y':
                case 'Y':
                        if (IS_FEXPR_TILDE(expr)) {
                                eptr->ex_type = ET_YO;
                                /*$y takes no number */
                                if (isdigit((int)(*expr->exp_str)))
                                        break;
                                /* for $y[] is a shorhand for $y1[] */
                                /* eptr->ex_int = 0; */
                                                                eptr->ex_op = 0;
                                                                expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                                goto noinletnum;
                        }
                        post("$y works only for fexpr~");
                                /* falls through */
                                /*
                                 * allow $# for abstraction argument substitution
                                 *  $1+1 is translated to 0+1 and in abstraction substitution
                                 *  the value is replaced with the new string
                                 */
                                case '0':
                                case '1':
                                case '2':
                                case '3':
                                case '4':
                                case '5':
                                case '6':
                                case '7':
                                case '8':
                                case '9':
                                        p = atoif(--expr->exp_str, &eptr->ex_op, &i);
                        if (!p)
                        return (1);
                                        if (i != ET_INT) {
                                                post("expr: syntax error: %s\n", expr->exp_str);
                                                return (1);
                                        }
                        expr->exp_str = p;
                                        eptr->ex_type = ET_INT;
                                        eptr->ex_int = 0;
                        return (0);
                default:
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                }
                p = atoif(expr->exp_str, &eptr->ex_op, &i);
                if (!p) {
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                }
                if (i != ET_INT) {
                        post("expr: syntax error: %s\n", expr->exp_str);
                        return (1);
                }
                /*
                 * make the user inlets one based rather than zero based
                 * therefore we decrement the number that user has supplied
                 */
                if (!eptr->ex_op || (eptr->ex_op)-- > MAX_VARS) {
                 post("expr: syntax error: inlet or outlet out of range: %s\n",
                                                             expr->exp_str);
                        return (1);
                }

                /*
                 * until we can change the input type of inlets on
                 * the fly (at pd_new()
                 * time) the first input to expr~ is always a vector
                 * and $f1 or $i1 is
                 * illegal for fexpr~
                 */
                if (eptr->ex_op == 0 &&
                   (IS_FEXPR_TILDE(expr) ||  IS_EXPR_TILDE(expr)) &&
                   (eptr->ex_type==ET_II || eptr->ex_type==ET_FI ||
                                                        eptr->ex_type==ET_SI)) {
                       post("first inlet of expr~/fexpr~ can only be a vector");
                       return (1);
                }
                /* record the inlet or outlet type and check for consistency */
                if (eptr->ex_type == ET_YO ) {
                        /* it is an outlet  for fexpr~*/
                        /* no need to do anything */
                        ;
                } else if (!expr->exp_var[eptr->ex_op].ex_type)
                        expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                else if (expr->exp_var[eptr->ex_op].ex_type != eptr->ex_type) {
                        post("expr: syntax error: inlets can only have one type: %s\n", expr->exp_str);
                        return (1);
                }
                expr->exp_str = p;
noinletnum:
                break;
        case '"':
                {
                        struct ex_ex ex = { 0 };

                        p = expr->exp_str;
                        if (!*expr->exp_str || *expr->exp_str == '"') {
                                post("expr: syntax error: empty symbol: %s\n", --expr->exp_str);
                                return (1);
                        }
                        if (getoken(expr, &ex))
                                return (1);
                        switch (ex.ex_type) {
                        case ET_STR:
                                if (ex_getsym(ex.ex_ptr, (t_symbol **)&(eptr->ex_ptr))) {
                                        post("expr: syntax error: getoken: problms with ex_getsym\n");
                                        return (1);
                                }
                                eptr->ex_type = ET_SYM;
                                break;
                        case ET_SI:
                                *eptr = ex;
                                eptr->ex_type = ET_VSYM;
                                break;
                        default:
                                post("expr: syntax error: bad symbol name: %s\n", p);
                                return (1);
                        }
                        if (*expr->exp_str++ != '"') {
                                post("expr: syntax error: missing '\"'\n");
                                return (1);
                        }
                        break;
                }
        case '.':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
                p = atoif(--expr->exp_str, &eptr->ex_int, &eptr->ex_type);
                if (!p)
                        return (1);
                expr->exp_str = p;
                break;

        default:
                /*
                 * has to be a string, it should either be a
                 * function or a table
                 */
                p = --expr->exp_str;
                for (i = 0; name_ok(*p); i++)
                        p++;
                if (!i) {
                        post("expr: syntax error: %s\n", expr->exp_str);
                        return (1);
                }
                eptr->ex_ptr = (char *)fts_malloc(i + 1);
                strncpy(eptr->ex_ptr, expr->exp_str, (int) i);
                (eptr->ex_ptr)[i] = 0;
                expr->exp_str = p;
                /*
                 * we mark this as a string and later we will change this
                 * to either a function or a table
                 */
                eptr->ex_type = ET_STR;
                break;
        }
        return (0);
}